

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

RuleInfo * __thiscall
anon_unknown.dwarf_12f2cc::BuildEngineImpl::getRuleInfoForKey(BuildEngineImpl *this,KeyID keyID)

{
  BuildEngineDelegate *pBVar1;
  bool bVar2;
  pointer ppVar3;
  KeyType local_60;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_40;
  KeyID local_38;
  _Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  local_28;
  iterator it;
  BuildEngineImpl *this_local;
  KeyID keyID_local;
  
  it.
  super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
             )(_Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
               )this;
  this_local = (BuildEngineImpl *)keyID._value;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
       ::find(&this->ruleInfos,(key_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
       ::end(&this->ruleInfos);
  bVar2 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
                           *)&local_28);
    keyID_local._value = (ValueTy)&ppVar3->second;
  }
  else {
    local_38._value = (ValueTy)this_local;
    pBVar1 = this->delegate;
    (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[3])(&local_60,this,this_local);
    (*pBVar1->_vptr_BuildEngineDelegate[3])(&local_40,pBVar1,&local_60);
    keyID_local._value = (ValueTy)addRule(this,local_38,&local_40);
    std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
              (&local_40);
    llbuild::core::KeyType::~KeyType(&local_60);
  }
  return (RuleInfo *)keyID_local._value;
}

Assistant:

RuleInfo& getRuleInfoForKey(KeyID keyID) {
    // Check if we have already found the rule.
    auto it = ruleInfos.find(keyID);
    if (it != ruleInfos.end())
      return it->second;

    // Otherwise, we need to resolve the full key so we can request it from the
    // delegate.
    return addRule(keyID, delegate.lookupRule(getKeyForID(keyID)));
  }